

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

string * Kernel::getQuantifiedStr<Lib::Set<unsigned_int,Lib::DefaultHash>>
                   (Set<unsigned_int,_Lib::DefaultHash> *vars,string *inner,
                   DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *t_map
                   ,bool innerParentheses)

{
  Iterator it;
  bool bVar1;
  string *in_RDX;
  string *in_RDI;
  byte in_R8B;
  TermList t;
  string ty;
  uint var;
  bool first;
  string varStr;
  VirtualIterator<unsigned_int> vit;
  TermList *in_stack_fffffffffffffcb8;
  Problem *in_stack_fffffffffffffcc0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffcc8;
  undefined7 uVar2;
  undefined1 topLevel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [36];
  undefined4 local_23c;
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [12];
  uint in_stack_fffffffffffffdfc;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [39];
  undefined1 local_189 [33];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  TermList local_a8;
  allocator<char> local_99;
  string local_98 [32];
  uint local_78;
  byte local_61;
  string local_60 [32];
  Type local_40;
  byte local_21;
  
  uVar2 = SUB87(in_RDI,0);
  topLevel = (undefined1)((ulong)in_RDI >> 0x38);
  local_21 = in_R8B & 1;
  local_40 = Lib::getContentIterator<Lib::Set<unsigned_int,Lib::DefaultHash>const>
                       ((Set<unsigned_int,_Lib::DefaultHash> *)0x8666e2);
  it._next._7_1_ = topLevel;
  it._next._0_7_ = uVar2;
  it._last = (Cell *)in_RDI;
  Lib::pvi<Lib::Set<unsigned_int,Lib::DefaultHash>::Iterator>(it);
  std::__cxx11::string::string(local_60);
  local_61 = 1;
  while (bVar1 = Lib::VirtualIterator<unsigned_int>::hasNext
                           ((VirtualIterator<unsigned_int> *)0x866731), bVar1) {
    local_78 = Lib::VirtualIterator<unsigned_int>::next((VirtualIterator<unsigned_int> *)0x866751);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd00,(char *)in_RDI,(allocator<char> *)CONCAT17(topLevel,uVar2))
    ;
    std::allocator<char>::~allocator(&local_99);
    TermList::TermList(&local_a8);
    bVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      (in_stack_fffffffffffffcc8,(uint *)in_stack_fffffffffffffcc0,
                       in_stack_fffffffffffffcb8);
    if (bVar1) {
      Lib::Environment::getMainProblem((Environment *)&Lib::env);
      bVar1 = Problem::hasNonDefaultSorts(in_stack_fffffffffffffcc0);
      if (bVar1) {
        TermList::toString_abi_cxx11_((TermList *)in_RDI,(bool)topLevel);
        std::operator+((char *)in_stack_fffffffffffffcc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcc0);
        std::__cxx11::string::operator=(local_98,local_c8);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string(local_e8);
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
    if (bVar1) {
      if ((local_61 & 1) == 0) {
        std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        std::__cxx11::string::operator=(local_60,local_108);
        std::__cxx11::string::~string(local_108);
      }
      in_stack_fffffffffffffcc8 =
           (DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,(char *)in_RDI,
                 (allocator<char> *)CONCAT17(topLevel,uVar2));
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffdfc);
      std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(topLevel,uVar2));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator=(local_60,local_128);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string((string *)(local_189 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_189);
    }
    else {
      if ((local_61 & 1) == 0) {
        std::__cxx11::string::operator+=(local_60,",");
      }
      in_stack_fffffffffffffcc0 = (Problem *)&local_211;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd00,(char *)in_RDI,
                 (allocator<char> *)CONCAT17(topLevel,uVar2));
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffffdfc);
      std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(topLevel,uVar2));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0);
      std::__cxx11::string::operator+=(local_60,local_1d0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator(&local_211);
    }
    local_61 = 0;
    std::__cxx11::string::~string(local_98);
  }
  if ((local_61 & 1) == 0) {
    if ((local_21 & 1) == 0) {
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd00);
    }
    else {
      std::operator+(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_2a0);
    }
  }
  else {
    std::__cxx11::string::string((string *)CONCAT17(topLevel,uVar2),in_RDX);
  }
  local_23c = 1;
  std::__cxx11::string::~string(local_60);
  Lib::VirtualIterator<unsigned_int>::~VirtualIterator
            ((VirtualIterator<unsigned_int> *)in_stack_fffffffffffffcc0);
  return in_RDI;
}

Assistant:

std::string getQuantifiedStr(const VarContainer& vars, std::string inner, DHMap<unsigned,TermList>& t_map, bool innerParentheses=true){
  VirtualIterator<unsigned> vit=pvi( getContentIterator(vars) );
  std::string varStr;
  bool first=true;
  while(vit.hasNext()) {
    unsigned var =vit.next();
    std::string ty="";
    TermList t;

    if(t_map.find(var,t) && env.getMainProblem()->hasNonDefaultSorts()){
      //hasNonDefaultSorts is true if the problem contains a sort
      //that is not $i and not a variable
      ty=" : " + t.toString();
    }
    if(ty == " : $tType"){
      if (!first) { varStr = "," + varStr; }
      varStr=std::string("X")+Int::toString(var)+ty + varStr;
    } else {
      if (!first) { varStr+=","; }
      varStr+=std::string("X")+Int::toString(var)+ty;
    }
    first=false;
  }

  if (first) {
    //we didn't quantify any variable
    return inner;
  }

  if (innerParentheses) {
    return "( ! ["+varStr+"] : ("+inner+") )";
  }
  else {
    return "( ! ["+varStr+"] : "+inner+" )";
  }
}